

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O0

void plutovg_path_traverse
               (plutovg_path_t *path,plutovg_path_traverse_func_t traverse_func,void *closure)

{
  _Bool _Var1;
  plutovg_path_command_t pVar2;
  plutovg_point_t local_48;
  plutovg_point_t points [3];
  plutovg_path_iterator_t it;
  void *closure_local;
  plutovg_path_traverse_func_t traverse_func_local;
  plutovg_path_t *path_local;
  
  plutovg_path_iterator_init((plutovg_path_iterator_t *)(points + 2),path);
  while (_Var1 = plutovg_path_iterator_has_next((plutovg_path_iterator_t *)(points + 2)), _Var1) {
    pVar2 = plutovg_path_iterator_next((plutovg_path_iterator_t *)(points + 2),&local_48);
    switch(pVar2) {
    case PLUTOVG_PATH_COMMAND_MOVE_TO:
      (*traverse_func)(closure,PLUTOVG_PATH_COMMAND_MOVE_TO,&local_48,1);
      break;
    case PLUTOVG_PATH_COMMAND_LINE_TO:
      (*traverse_func)(closure,PLUTOVG_PATH_COMMAND_LINE_TO,&local_48,1);
      break;
    case PLUTOVG_PATH_COMMAND_CUBIC_TO:
      (*traverse_func)(closure,PLUTOVG_PATH_COMMAND_CUBIC_TO,&local_48,3);
      break;
    case PLUTOVG_PATH_COMMAND_CLOSE:
      (*traverse_func)(closure,PLUTOVG_PATH_COMMAND_CLOSE,&local_48,1);
    }
  }
  return;
}

Assistant:

void plutovg_path_traverse(const plutovg_path_t* path, plutovg_path_traverse_func_t traverse_func, void* closure)
{
    plutovg_path_iterator_t it;
    plutovg_path_iterator_init(&it, path);

    plutovg_point_t points[3];
    while(plutovg_path_iterator_has_next(&it)) {
        switch(plutovg_path_iterator_next(&it, points)) {
        case PLUTOVG_PATH_COMMAND_MOVE_TO:
            traverse_func(closure, PLUTOVG_PATH_COMMAND_MOVE_TO, points, 1);
            break;
        case PLUTOVG_PATH_COMMAND_LINE_TO:
            traverse_func(closure, PLUTOVG_PATH_COMMAND_LINE_TO, points, 1);
            break;
        case PLUTOVG_PATH_COMMAND_CUBIC_TO:
            traverse_func(closure, PLUTOVG_PATH_COMMAND_CUBIC_TO, points, 3);
            break;
        case PLUTOVG_PATH_COMMAND_CLOSE:
            traverse_func(closure, PLUTOVG_PATH_COMMAND_CLOSE, points, 1);
            break;
        }
    }
}